

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_encoder.c
# Opt level: O0

int pt_encode_mode_tsx(pt_encoder *encoder,uint8_t bits)

{
  int iVar1;
  undefined1 local_30 [8];
  pt_packet packet;
  uint8_t bits_local;
  pt_encoder *encoder_local;
  
  local_30._0_4_ = ppt_mode;
  packet.type = 0x20;
  if ((bits & 1) == 0) {
    packet.size = packet.size & 0xfe;
  }
  else {
    packet.size = packet.size & 0xfe | 1;
  }
  if ((bits & 2) == 0) {
    packet.size = packet.size & 0xfd;
  }
  else {
    packet.size = packet.size & 0xfd | 2;
  }
  packet.payload.tnt.payload._7_1_ = bits;
  iVar1 = pt_enc_next(encoder,(pt_packet *)local_30);
  return iVar1;
}

Assistant:

int pt_encode_mode_tsx(struct pt_encoder *encoder, uint8_t bits)
{
	struct pt_packet packet;

	packet.type = ppt_mode;
	packet.payload.mode.leaf = pt_mol_tsx;

	if (bits & pt_mob_tsx_intx)
		packet.payload.mode.bits.tsx.intx = 1;
	else
		packet.payload.mode.bits.tsx.intx = 0;

	if (bits & pt_mob_tsx_abrt)
		packet.payload.mode.bits.tsx.abrt = 1;
	else
		packet.payload.mode.bits.tsx.abrt = 0;

	return pt_enc_next(encoder, &packet);
}